

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTuple.h
# Opt level: O2

void __thiscall
chrono::ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>::MultiplyAndAdd
          (ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_> *this,
          double *result,ChVectorDynamic<double> *vect)

{
  Scalar SVar1;
  VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> VStack_a8;
  Product<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
  local_70;
  
  if (this->variables_1->disabled == false) {
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&VStack_a8,vect,(long)this->variables_1->offset,6);
    Eigen::
    Product<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>
    ::Product(&local_70,&this->Cq_1,
              &VStack_a8.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
    SVar1 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_70);
    *result = SVar1 + *result;
  }
  if (this->variables_2->disabled == false) {
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&VStack_a8,vect,(long)this->variables_2->offset,6);
    Eigen::
    Product<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>
    ::Product(&local_70,&this->Cq_2,
              &VStack_a8.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
    SVar1 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_70);
    *result = SVar1 + *result;
  }
  if (this->variables_3->disabled == false) {
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&VStack_a8,vect,(long)this->variables_3->offset,6);
    Eigen::
    Product<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>
    ::Product(&local_70,&this->Cq_3,
              &VStack_a8.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
    SVar1 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_70);
    *result = SVar1 + *result;
  }
  return;
}

Assistant:

void MultiplyAndAdd(double& result, const ChVectorDynamic<double>& vect) const {
        if (variables_1->IsActive()) {
            result += Cq_1 * vect.segment(variables_1->GetOffset(), T::nvars1);
        }

        if (variables_2->IsActive()) {
            result += Cq_2 * vect.segment(variables_2->GetOffset(), T::nvars2);
        }

        if (variables_3->IsActive()) {
            result += Cq_3 * vect.segment(variables_3->GetOffset(), T::nvars3);
        }
    }